

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

vec3 __thiscall vera::Triangle::getClosestPoint(Triangle *this,vec3 *_p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar14;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar19;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar20;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar21;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar22;
  float fVar23;
  vec3 vVar24;
  vec3 local_30;
  vec3 local_20;
  vec3 local_10;
  
  fVar10 = this->m_vertices[0].field_0.x;
  fVar17 = this->m_vertices[1].field_0.x;
  fVar16 = this->m_vertices[2].field_0.x;
  uVar1 = this->m_vertices[0].field_1;
  uVar5 = this->m_vertices[0].field_2;
  uVar2 = this->m_vertices[1].field_1;
  uVar6 = this->m_vertices[1].field_2;
  aVar19.y = (float)uVar2 - (float)uVar1;
  aVar20.z = (float)uVar6 - (float)uVar5;
  uVar3 = this->m_vertices[2].field_1;
  uVar7 = this->m_vertices[2].field_2;
  aVar15.y = (float)uVar3 - (float)uVar1;
  local_20.field_2.z = (float)uVar7 - (float)uVar5;
  aVar21.x = fVar17 - fVar10;
  aVar22.x = fVar16 - fVar10;
  fVar9 = aVar20.z * aVar15.y - local_20.field_2.z * aVar19.y;
  local_10.field_1.y = aVar19.y;
  local_10.field_0.x = aVar21.x;
  local_20.field_1.y = aVar15.y;
  local_20.field_0.x = aVar22.x;
  fVar11 = local_20.field_2.z * aVar21.x - aVar20.z * aVar22.x;
  fVar13 = aVar19.y * aVar22.x - aVar21.x * aVar15.y;
  fVar18 = 1.0 / SQRT(fVar13 * fVar13 + fVar9 * fVar9 + fVar11 * fVar11);
  uVar4 = _p->field_1;
  uVar8 = _p->field_2;
  fVar12 = ((float)uVar8 - (float)uVar5) * fVar18 * fVar13 +
           ((_p->field_0).x - fVar10) * fVar9 * fVar18 +
           ((float)uVar4 - (float)uVar1) * fVar18 * fVar11;
  fVar23 = (_p->field_0).x - fVar9 * fVar18 * fVar12;
  fVar9 = (float)uVar4 - fVar12 * fVar18 * fVar11;
  fVar11 = (float)uVar8 - fVar12 * fVar18 * fVar13;
  local_30.field_1.y = fVar9 - (float)uVar1;
  local_30.field_0.x = fVar23 - fVar10;
  local_30.field_2.z = fVar11 - (float)uVar5;
  local_10.field_2.z = aVar20.z;
  vVar24 = getBarycentric(&local_10,&local_20,&local_30);
  aVar14 = vVar24.field_2;
  aVar22 = vVar24.field_0;
  aVar15 = vVar24.field_1;
  if (0.0 <= aVar22.x) {
    if (0.0 <= aVar15.y) {
      if (0.0 <= aVar14.z) {
        fVar17 = fVar16 * aVar14.z + fVar17 * aVar15.y + fVar10 * aVar22.x;
        fVar10 = (float)uVar3 * aVar14.z + (float)uVar2 * aVar15.y + (float)uVar1 * aVar22.x;
        aVar14.z = (float)uVar7 * aVar14.z + (float)uVar6 * aVar15.y + (float)uVar5 * aVar22.x;
      }
      else {
        fVar17 = SQRT(aVar20.z * aVar20.z + aVar21.x * aVar21.x + aVar19.y * aVar19.y);
        fVar9 = ((fVar11 - (float)uVar5) * aVar20.z +
                (fVar23 - fVar10) * aVar21.x + (fVar9 - (float)uVar1) * aVar19.y) / fVar17;
        fVar16 = fVar17;
        if (fVar9 <= fVar17) {
          fVar16 = fVar9;
        }
        if (fVar16 <= 0.0) {
          fVar16 = 0.0;
        }
        fVar16 = fVar16 / fVar17;
        fVar17 = fVar10 + aVar21.x * fVar16;
        fVar10 = (float)uVar1 + fVar16 * aVar19.y;
        aVar14.z = (float)uVar5 + fVar16 * aVar20.z;
      }
    }
    else {
      fVar10 = fVar10 - fVar16;
      fVar12 = (float)uVar1 - (float)uVar3;
      fVar13 = (float)uVar5 - (float)uVar7;
      fVar17 = SQRT(fVar13 * fVar13 + fVar10 * fVar10 + fVar12 * fVar12);
      fVar11 = ((fVar11 - (float)uVar7) * fVar13 +
               (fVar23 - fVar16) * fVar10 + (fVar9 - (float)uVar3) * fVar12) / fVar17;
      fVar9 = fVar17;
      if (fVar11 <= fVar17) {
        fVar9 = fVar11;
      }
      if (fVar9 <= 0.0) {
        fVar9 = 0.0;
      }
      fVar9 = fVar9 / fVar17;
      fVar17 = fVar16 + fVar10 * fVar9;
      fVar10 = fVar9 * fVar12 + (float)uVar3;
      aVar14.z = fVar9 * fVar13 + (float)uVar7;
    }
  }
  else {
    fVar16 = fVar16 - fVar17;
    fVar12 = (float)uVar3 - (float)uVar2;
    fVar13 = (float)uVar7 - (float)uVar6;
    fVar10 = SQRT(fVar13 * fVar13 + fVar16 * fVar16 + fVar12 * fVar12);
    fVar11 = ((fVar11 - (float)uVar6) * fVar13 +
             (fVar23 - fVar17) * fVar16 + (fVar9 - (float)uVar2) * fVar12) / fVar10;
    fVar9 = fVar10;
    if (fVar11 <= fVar10) {
      fVar9 = fVar11;
    }
    if (fVar9 <= 0.0) {
      fVar9 = 0.0;
    }
    fVar9 = fVar9 / fVar10;
    fVar17 = fVar16 * fVar9 + fVar17;
    fVar10 = fVar9 * fVar12 + (float)uVar2;
    aVar14.z = fVar9 * fVar13 + (float)uVar6;
  }
  vVar24.field_1.y = fVar10;
  vVar24.field_0.x = fVar17;
  vVar24.field_2.z = aVar14.z;
  return vVar24;
}

Assistant:

glm::vec3 Triangle::getClosestPoint(const glm::vec3& _p) const {
    // https://github.com/nmoehrle/libacc/blob/master/primitives.h#L71
    glm::vec3 ab = m_vertices[1] - m_vertices[0];
    glm::vec3 ac = m_vertices[2] - m_vertices[0];
    glm::vec3 normal = glm::normalize( glm::cross(ac,ab) );

    glm::vec3 p = _p - glm::dot(normal, _p - m_vertices[0]) * normal;
    glm::vec3 ap = p - m_vertices[0];

    glm::vec3 bcoords = getBarycentric(ab, ac, ap);

    if (bcoords[0] < 0.0f) {
        glm::vec3 bc = m_vertices[2] - m_vertices[1];
        float n = glm::length( bc ); // bc.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(bc, p - m_vertices[1]) / n, n));
        return m_vertices[1] + t / n * bc;
    }

    if (bcoords[1] < 0.0f) {
        glm::vec3 ca = m_vertices[0] - m_vertices[2];
        float n = glm::length( ca ); //ca.norm();
        float t = glm::max(0.0f, glm::min( glm::dot(ca, p - m_vertices[2]) / n, n));
        return m_vertices[2] + t / n * ca;
    }

    if (bcoords[2] < 0.0f) {
        //glm::vec3 ab = m_vertices[1] - m_vertices[0];
        float n = glm::length( ab ); //ab.norm();
        
        float t = glm::max(0.0f, glm::min( glm::dot(ab, p - m_vertices[0]) / n, n));
        return m_vertices[0] + t / n * ab;
    }

    return (m_vertices[0] * bcoords[0] + m_vertices[1] * bcoords[1] + m_vertices[2] * bcoords[2]);
}